

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::UnitTypeString(uint UT)

{
  undefined1 auStack_18 [4];
  uint UT_local;
  
  switch(UT) {
  case 1:
    StringRef::StringRef((StringRef *)auStack_18,"DW_UT_compile");
    break;
  case 2:
    StringRef::StringRef((StringRef *)auStack_18,"DW_UT_type");
    break;
  case 3:
    StringRef::StringRef((StringRef *)auStack_18,"DW_UT_partial");
    break;
  case 4:
    StringRef::StringRef((StringRef *)auStack_18,"DW_UT_skeleton");
    break;
  case 5:
    StringRef::StringRef((StringRef *)auStack_18,"DW_UT_split_compile");
    break;
  case 6:
    StringRef::StringRef((StringRef *)auStack_18,"DW_UT_split_type");
    break;
  default:
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::UnitTypeString(unsigned UT) {
  switch (UT) {
  default:
    return StringRef();
#define HANDLE_DW_UT(ID, NAME)                                                 \
  case DW_UT_##NAME:                                                           \
    return "DW_UT_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}